

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# addrman.cpp
# Opt level: O0

void __thiscall AddrManImpl::ClearNew(AddrManImpl *this,int nUBucket,int nUBucketPos)

{
  string_view source_file;
  bool bVar1;
  mapped_type *pmVar2;
  int in_EDX;
  uint in_ESI;
  LogFlags in_RDI;
  long in_FS_OFFSET;
  string_view in_stack_00000000;
  AddrInfo *infoDelete;
  nid_type nIdDelete;
  Level in_stack_000000e0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_000000f0;
  int *in_stack_000000f8;
  int *in_stack_00000100;
  undefined4 in_stack_ffffffffffffff38;
  undefined4 uVar3;
  int in_stack_ffffffffffffff3c;
  key_type *in_stack_ffffffffffffff40;
  unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
  *in_stack_ffffffffffffff48;
  char *in_stack_ffffffffffffff50;
  AddrManImpl *in_stack_ffffffffffffff58;
  nid_type in_stack_ffffffffffffff68;
  LogFlags flag;
  int in_stack_ffffffffffffffac;
  undefined4 local_30;
  undefined4 local_2c;
  undefined8 in_stack_ffffffffffffffe8;
  undefined8 in_stack_fffffffffffffff0;
  char *pcVar4;
  
  pcVar4 = *(char **)(in_FS_OFFSET + 0x28);
  flag = in_RDI;
  local_30 = in_EDX;
  local_2c = in_ESI;
  AssertLockHeldInternal<AnnotatedMixin<std::mutex>>
            ((char *)in_stack_ffffffffffffff48,(char *)in_stack_ffffffffffffff40,
             in_stack_ffffffffffffff3c,(AnnotatedMixin<std::mutex> *)0xee47a1);
  if (*(long *)(in_RDI + (LIBEVENT|ESTIMATEFEE|RPC) + (long)(int)local_2c * 0x200 +
               (long)(int)local_30 * 8) != -1) {
    pmVar2 = std::
             unordered_map<long,_AddrInfo,_std::hash<long>,_std::equal_to<long>,_std::allocator<std::pair<const_long,_AddrInfo>_>_>
             ::operator[](in_stack_ffffffffffffff48,in_stack_ffffffffffffff40);
    if (pmVar2->nRefCount < 1) {
      __assert_fail("infoDelete.nRefCount > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/addrman.cpp"
                    ,0x1e1,"void AddrManImpl::ClearNew(int, int)");
    }
    pmVar2->nRefCount = pmVar2->nRefCount + -1;
    *(undefined8 *)
     (in_RDI + (LIBEVENT|ESTIMATEFEE|RPC) + (long)(int)local_2c * 0x200 + (long)(int)local_30 * 8) =
         0xffffffffffffffff;
    bVar1 = ::LogAcceptCategory(CONCAT44(in_stack_ffffffffffffff3c,in_stack_ffffffffffffff38),Trace)
    ;
    if (bVar1) {
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_ffffffffffffff58,
                 in_stack_ffffffffffffff50);
      CService::ToStringAddrPort_abi_cxx11_((CService *)&stack0xffffffffffffffd8);
      in_stack_ffffffffffffff58 = (AddrManImpl *)&stack0xffffffffffffffd0;
      uVar3 = 1;
      source_file._M_str = pcVar4;
      source_file._M_len = in_stack_fffffffffffffff0;
      LogPrintFormatInternal<std::__cxx11::string,int,int>
                (in_stack_00000000,source_file,in_stack_ffffffffffffffac,flag,in_stack_000000e0,
                 (ConstevalFormatString<3U>)in_stack_ffffffffffffffe8,in_stack_000000f0,
                 in_stack_000000f8,in_stack_00000100);
      std::__cxx11::string::~string
                ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 CONCAT44(in_stack_ffffffffffffff3c,uVar3));
    }
    if (pmVar2->nRefCount == 0) {
      Delete(in_stack_ffffffffffffff58,in_stack_ffffffffffffff68);
    }
  }
  if (*(char **)(in_FS_OFFSET + 0x28) != pcVar4) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void AddrManImpl::ClearNew(int nUBucket, int nUBucketPos)
{
    AssertLockHeld(cs);

    // if there is an entry in the specified bucket, delete it.
    if (vvNew[nUBucket][nUBucketPos] != -1) {
        nid_type nIdDelete = vvNew[nUBucket][nUBucketPos];
        AddrInfo& infoDelete = mapInfo[nIdDelete];
        assert(infoDelete.nRefCount > 0);
        infoDelete.nRefCount--;
        vvNew[nUBucket][nUBucketPos] = -1;
        LogDebug(BCLog::ADDRMAN, "Removed %s from new[%i][%i]\n", infoDelete.ToStringAddrPort(), nUBucket, nUBucketPos);
        if (infoDelete.nRefCount == 0) {
            Delete(nIdDelete);
        }
    }
}